

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_partition_tables.cpp
# Opt level: O1

void build_partition_table_for_one_partition_count
               (block_size_descriptor *bsd,bool can_omit_partitionings,uint partition_count_cutoff,
               uint partition_count,partition_info *ptab,uint64_t *canonical_patterns)

{
  uint64_t *puVar1;
  bool bVar2;
  uint uVar3;
  byte bVar4;
  uint partition_remap_index;
  ulong uVar5;
  uint i;
  long lVar6;
  undefined7 in_register_00000031;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  partition_info *pi;
  bool bVar13;
  uint8_t build [1024];
  int local_46c;
  undefined1 local_458 [16];
  ulong local_448;
  partition_info *local_440;
  char local_438 [1032];
  
  uVar3 = partition_count - 1;
  bsd->partitioning_count_selected[uVar3] = 0;
  bsd->partitioning_count_all[uVar3] = 0;
  local_46c = 2;
  if (((int)CONCAT71(in_register_00000031,can_omit_partitionings) == 0) ||
     (local_46c = 1, partition_count <= partition_count_cutoff)) {
    local_440 = ptab;
    memset(local_438,0,0x400);
    local_448 = (ulong)partition_count;
    uVar12 = 0;
    iVar11 = 0;
    do {
      lVar6 = 0;
      do {
        if ((iVar11 != 1) || (local_438[lVar6] == '\0')) {
          pi = local_440 + uVar12;
          partition_remap_index = (uint)uVar12;
          bVar2 = generate_one_partition_info_entry
                            (bsd,(uint)local_448,(uint)lVar6,partition_remap_index,pi);
          if ((iVar11 != 0) || (bVar2)) {
            bVar4 = bsd->texel_count;
            puVar1 = canonical_patterns + partition_remap_index * 7;
            puVar1[3] = 0;
            puVar1[4] = 0;
            puVar1[5] = 0;
            puVar1[6] = 0;
            *puVar1 = 0;
            puVar1[1] = 0;
            puVar1[2] = 0;
            puVar1[3] = 0;
            local_458 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            if ((ulong)bVar4 != 0) {
              bVar7 = 0;
              uVar9 = 0;
              iVar10 = 0;
              do {
                uVar5 = (ulong)pi->partition_of_texel[uVar9];
                if (*(int *)(local_458 + uVar5 * 4) < 0) {
                  *(int *)(local_458 + uVar5 * 4) = iVar10;
                  iVar10 = iVar10 + 1;
                }
                puVar1[uVar9 >> 5 & 0x7ffffff] =
                     puVar1[uVar9 >> 5 & 0x7ffffff] |
                     (long)*(int *)(local_458 + uVar5 * 4) << (bVar7 & 0x3e);
                uVar9 = uVar9 + 1;
                bVar7 = bVar7 + 2;
              } while (bVar4 != uVar9);
            }
            if (partition_remap_index == 0) {
              bVar4 = 1;
            }
            else {
              bVar4 = 1;
              uVar8 = 0;
              uVar9 = 1;
              do {
                if ((((*puVar1 == canonical_patterns[uVar8]) &&
                     (puVar1[1] == canonical_patterns[(ulong)uVar8 + 1])) &&
                    (puVar1[2] == canonical_patterns[(ulong)uVar8 + 2])) &&
                   (((puVar1[3] == canonical_patterns[(ulong)uVar8 + 3] &&
                     (puVar1[4] == canonical_patterns[(ulong)uVar8 + 4])) &&
                    (puVar1[5] == canonical_patterns[(ulong)uVar8 + 5])))) {
                  bVar13 = puVar1[6] == canonical_patterns[(ulong)uVar8 + 6];
                }
                else {
                  bVar13 = false;
                }
                if (bVar13) {
                  bVar4 = 0;
                  break;
                }
                uVar8 = uVar8 + 7;
                bVar13 = uVar9 < uVar12;
                uVar9 = uVar9 + 1;
              } while (bVar13);
            }
            if ((bVar2 & bVar4) == 1) {
              if (iVar11 == 0) {
                bsd->partitioning_packed_index[partition_count - 2][lVar6] = (uint16_t)uVar12;
                bsd->partitioning_count_selected[uVar3] =
                     bsd->partitioning_count_selected[uVar3] + 1;
                bsd->partitioning_count_all[uVar3] = bsd->partitioning_count_all[uVar3] + 1;
                local_438[lVar6] = '\x01';
LAB_0027682d:
                uVar12 = (ulong)(partition_remap_index + 1);
              }
            }
            else if (iVar11 == 1) {
              bsd->partitioning_packed_index[partition_count - 2][lVar6] = (uint16_t)uVar12;
              bsd->partitioning_count_all[uVar3] = bsd->partitioning_count_all[uVar3] + 1;
              goto LAB_0027682d;
            }
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x400);
      iVar11 = iVar11 + 1;
    } while (iVar11 != local_46c);
  }
  return;
}

Assistant:

static void build_partition_table_for_one_partition_count(
	block_size_descriptor& bsd,
	bool can_omit_partitionings,
	unsigned int partition_count_cutoff,
	unsigned int partition_count,
	partition_info* ptab,
	uint64_t* canonical_patterns
) {
	unsigned int next_index = 0;
	bsd.partitioning_count_selected[partition_count - 1] = 0;
	bsd.partitioning_count_all[partition_count - 1] = 0;

	// Skip tables larger than config max partition count if we can omit modes
	if (can_omit_partitionings && (partition_count > partition_count_cutoff))
	{
		return;
	}

	// Iterate through twice
	//   - Pass 0: Keep selected partitionings
	//   - Pass 1: Keep non-selected partitionings (skip if in omit mode)
	unsigned int max_iter = can_omit_partitionings ? 1 : 2;

	// Tracker for things we built in the first iteration
	uint8_t build[BLOCK_MAX_PARTITIONINGS] { 0 };
	for (unsigned int x = 0; x < max_iter; x++)
	{
		for (unsigned int i = 0; i < BLOCK_MAX_PARTITIONINGS; i++)
		{
			// Don't include things we built in the first pass
			if ((x == 1) && build[i])
			{
				continue;
			}

			bool keep_useful = generate_one_partition_info_entry(bsd, partition_count, i, next_index, ptab[next_index]);
			if ((x == 0) && !keep_useful)
			{
				continue;
			}

			generate_canonical_partitioning(bsd.texel_count, ptab[next_index].partition_of_texel, canonical_patterns + next_index * BIT_PATTERN_WORDS);
			bool keep_canonical = true;
			for (unsigned int j = 0; j < next_index; j++)
			{
				bool match = compare_canonical_partitionings(canonical_patterns + next_index * BIT_PATTERN_WORDS, canonical_patterns +  j * BIT_PATTERN_WORDS);
				if (match)
				{
					keep_canonical = false;
					break;
				}
			}

			if (keep_useful && keep_canonical)
			{
				if (x == 0)
				{
					bsd.partitioning_packed_index[partition_count - 2][i] = static_cast<uint16_t>(next_index);
					bsd.partitioning_count_selected[partition_count - 1]++;
					bsd.partitioning_count_all[partition_count - 1]++;
					build[i] = 1;
					next_index++;
				}
			}
			else
			{
				if (x == 1)
				{
					bsd.partitioning_packed_index[partition_count - 2][i] = static_cast<uint16_t>(next_index);
					bsd.partitioning_count_all[partition_count - 1]++;
					next_index++;
				}
			}
		}
	}
}